

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O3

void __thiscall
vkt::synchronization::anon_unknown_0::ShaderAccess::ImageSupport::initPrograms
          (ImageSupport *this,SourceCollections *programCollection)

{
  VkImageType VVar1;
  TextureChannelClass TVar2;
  TextureFormat TVar3;
  long *plVar4;
  size_t sVar5;
  ostream *poVar6;
  long *plVar7;
  long lVar8;
  char *pcVar9;
  string imageType;
  string imageFormat;
  ostringstream declSrc;
  ostringstream mainSrc;
  long *local_3a0;
  long local_398;
  long local_390 [2];
  long *local_380;
  long local_378;
  long local_370;
  long lStack_368;
  string local_360;
  string local_340;
  long *local_320;
  long local_318;
  long local_310;
  long lStack_308;
  ios_base local_2b0 [264];
  undefined1 *local_1a8;
  undefined8 local_1a0;
  undefined1 local_198;
  undefined7 uStack_197;
  ios_base local_138 [264];
  
  TVar3 = ::vk::mapVkFormat((this->m_resourceDesc).imageFormat);
  switch(TVar3.type) {
  case SIGNED_INT8:
    break;
  case SIGNED_INT16:
    break;
  case SIGNED_INT32:
    break;
  case UNSIGNED_INT8:
    break;
  case UNSIGNED_INT16:
    break;
  case UNSIGNED_INT24:
    break;
  case UNSIGNED_INT32:
    break;
  case HALF_FLOAT:
    break;
  case FLOAT:
    break;
  default:
    if (TVar3.type < UNORM_INT24) {
      (*(code *)(&DAT_00b24e8c + *(int *)(&DAT_00b24e8c + ((ulong)TVar3 >> 0x20) * 4)))();
      return;
    }
  }
  local_1a0 = 0;
  local_198 = 0;
  local_1a8 = &local_198;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1a8);
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_310 = *plVar7;
    lStack_308 = plVar4[3];
    local_320 = &local_310;
  }
  else {
    local_310 = *plVar7;
    local_320 = (long *)*plVar4;
  }
  local_318 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_320);
  local_380 = &local_370;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_370 = *plVar7;
    lStack_368 = plVar4[3];
  }
  else {
    local_370 = *plVar7;
    local_380 = (long *)*plVar4;
  }
  local_378 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_320 != &local_310) {
    operator_delete(local_320,local_310 + 1);
  }
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8,CONCAT71(uStack_197,local_198) + 1);
  }
  VVar1 = (this->m_resourceDesc).imageType;
  TVar3 = ::vk::mapVkFormat((this->m_resourceDesc).imageFormat);
  TVar2 = tcu::getTextureChannelClass(TVar3.type);
  if (TVar2 == TEXTURECHANNELCLASS_UNSIGNED_INTEGER) {
    pcVar9 = "u";
  }
  else {
    TVar2 = tcu::getTextureChannelClass(TVar3.type);
    pcVar9 = "";
    if (TVar2 == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
      pcVar9 = "i";
    }
  }
  local_320 = &local_310;
  sVar5 = strlen(pcVar9);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,pcVar9,pcVar9 + sVar5);
  local_3a0 = local_390;
  if (VVar1 == VK_IMAGE_TYPE_3D) {
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3a0,local_320,local_318 + (long)local_320);
    std::__cxx11::string::append((char *)&local_3a0);
  }
  else if (VVar1 == VK_IMAGE_TYPE_2D) {
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3a0,local_320,local_318 + (long)local_320);
    std::__cxx11::string::append((char *)&local_3a0);
  }
  else {
    if (VVar1 != VK_IMAGE_TYPE_1D) {
      std::__throw_logic_error("basic_string::_M_construct null not valid");
    }
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3a0,local_320,local_318 + (long)local_320);
    std::__cxx11::string::append((char *)&local_3a0);
  }
  if (local_320 != &local_310) {
    operator_delete(local_320,local_310 + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_320,"layout(set = 0, binding = 0, ",0x1d);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_320,(char *)local_380,local_378);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,") readonly  uniform ",0x14);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_3a0,local_398);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," srcImg;\n",9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"layout(set = 0, binding = 1, ",0x1d);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_380,local_378);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,") writeonly uniform ",0x14);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_3a0,local_398);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," dstImg;\n",9);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  VVar1 = (this->m_resourceDesc).imageType;
  if (VVar1 == VK_IMAGE_TYPE_3D) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"    for (int z = 0; z < ",0x18);
    poVar6 = (ostream *)std::ostream::operator<<(&local_1a8,(this->m_resourceDesc).size.m_data[2]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"; ++z)\n",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    for (int y = 0; y < ",0x18);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(this->m_resourceDesc).size.m_data[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"; ++y)\n",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    for (int x = 0; x < ",0x18);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(this->m_resourceDesc).size.m_data[0]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"; ++x)\n",7);
    lVar8 = 0x4f;
    pcVar9 = "        imageStore(dstImg, ivec3(x, y, z), imageLoad(srcImg, ivec3(x, y, z)));\n";
  }
  else if (VVar1 == VK_IMAGE_TYPE_2D) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"    for (int y = 0; y < ",0x18);
    poVar6 = (ostream *)std::ostream::operator<<(&local_1a8,(this->m_resourceDesc).size.m_data[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"; ++y)\n",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    for (int x = 0; x < ",0x18);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(this->m_resourceDesc).size.m_data[0]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"; ++x)\n",7);
    lVar8 = 0x49;
    pcVar9 = "        imageStore(dstImg, ivec2(x, y), imageLoad(srcImg, ivec2(x, y)));\n";
  }
  else {
    if (VVar1 != VK_IMAGE_TYPE_1D) goto LAB_007bc659;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"    for (int x = 0; x < ",0x18);
    poVar6 = (ostream *)std::ostream::operator<<(&local_1a8,(this->m_resourceDesc).size.m_data[0]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"; ++x)\n",7);
    lVar8 = 0x35;
    pcVar9 = "        imageStore(dstImg, x, imageLoad(srcImg, x));\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar9,lVar8);
LAB_007bc659:
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  initPassthroughPrograms
            (programCollection,&this->m_shaderPrefix,&local_340,&local_360,this->m_stage);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_320);
  std::ios_base::~ios_base(local_2b0);
  if (local_3a0 != local_390) {
    operator_delete(local_3a0,local_390[0] + 1);
  }
  if (local_380 != &local_370) {
    operator_delete(local_380,local_370 + 1);
  }
  return;
}

Assistant:

void initPrograms (SourceCollections& programCollection) const
	{
		const std::string	imageFormat	= getShaderImageFormatQualifier(m_resourceDesc.imageFormat);
		const std::string	imageType	= getShaderImageType(m_resourceDesc.imageFormat, m_resourceDesc.imageType);

		std::ostringstream declSrc;
		declSrc << "layout(set = 0, binding = 0, " << imageFormat << ") readonly  uniform " << imageType << " srcImg;\n"
				<< "layout(set = 0, binding = 1, " << imageFormat << ") writeonly uniform " << imageType << " dstImg;\n";

		std::ostringstream mainSrc;
		if (m_resourceDesc.imageType == VK_IMAGE_TYPE_1D)
			mainSrc << "    for (int x = 0; x < " << m_resourceDesc.size.x() << "; ++x)\n"
					<< "        imageStore(dstImg, x, imageLoad(srcImg, x));\n";
		else if (m_resourceDesc.imageType == VK_IMAGE_TYPE_2D)
			mainSrc << "    for (int y = 0; y < " << m_resourceDesc.size.y() << "; ++y)\n"
					<< "    for (int x = 0; x < " << m_resourceDesc.size.x() << "; ++x)\n"
					<< "        imageStore(dstImg, ivec2(x, y), imageLoad(srcImg, ivec2(x, y)));\n";
		else if (m_resourceDesc.imageType == VK_IMAGE_TYPE_3D)
			mainSrc << "    for (int z = 0; z < " << m_resourceDesc.size.z() << "; ++z)\n"
					<< "    for (int y = 0; y < " << m_resourceDesc.size.y() << "; ++y)\n"
					<< "    for (int x = 0; x < " << m_resourceDesc.size.x() << "; ++x)\n"
					<< "        imageStore(dstImg, ivec3(x, y, z), imageLoad(srcImg, ivec3(x, y, z)));\n";
		else
			DE_ASSERT(0);

		initPassthroughPrograms(programCollection, m_shaderPrefix, declSrc.str(), mainSrc.str(), m_stage);
	}